

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua.c
# Opt level: O3

int pushline(lua_State *L,int firstline)

{
  int iVar1;
  size_t len;
  char *pcVar2;
  
  pcVar2 = "_PROMPT";
  if (firstline == 0) {
    pcVar2 = "_PROMPT2";
  }
  iVar1 = lua_getglobal(L,pcVar2);
  if (iVar1 == 0) {
    pcVar2 = "> ";
    if (firstline == 0) {
      pcVar2 = ">> ";
    }
  }
  else {
    pcVar2 = luaL_tolstring(L,-1,(size_t *)0x0);
    lua_rotate(L,-2,-1);
    lua_settop(L,-2);
  }
  pcVar2 = (char *)readline(pcVar2);
  if (pcVar2 == (char *)0x0) {
    iVar1 = 0;
  }
  else {
    lua_settop(L,-2);
    len = strlen(pcVar2);
    if (len == 0) {
      len = 0;
    }
    else if (pcVar2[len - 1] == '\n') {
      pcVar2[len - 1] = '\0';
      len = len - 1;
    }
    if ((firstline == 0) || (*pcVar2 != '=')) {
      lua_pushlstring(L,pcVar2,len);
    }
    else {
      lua_pushfstring(L,"return %s",pcVar2 + 1);
    }
    free(pcVar2);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int pushline (lua_State *L, int firstline) {
  char buffer[LUA_MAXINPUT];
  char *b = buffer;
  size_t l;
  const char *prmt = get_prompt(L, firstline);
  int readstatus = lua_readline(L, b, prmt);
  if (readstatus == 0)
    return 0;  /* no input (prompt will be popped by caller) */
  lua_pop(L, 1);  /* remove prompt */
  l = strlen(b);
  if (l > 0 && b[l-1] == '\n')  /* line ends with newline? */
    b[--l] = '\0';  /* remove it */
  if (firstline && b[0] == '=')  /* for compatibility with 5.2, ... */
    lua_pushfstring(L, "return %s", b + 1);  /* change '=' to 'return' */
  else
    lua_pushlstring(L, b, l);
  lua_freeline(L, b);
  return 1;
}